

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall
NNTreeImpl::findInternal
          (iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
          bool return_prev_if_not_found)

{
  NNTreeDetails *pNVar1;
  QPDF *pQVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  pointer pTVar8;
  offset_in_NNTreeImpl_to_subr in_R9;
  int local_484;
  int local_46c;
  allocator<char> local_379;
  string local_378;
  QPDFObjectHandle local_358;
  allocator<char> local_341;
  string local_340;
  code *local_320;
  undefined8 uStack_318;
  QPDFObjectHandle local_310;
  QPDFObjectHandle local_300;
  int local_2ec;
  code *pcStack_2e8;
  int idx_1;
  undefined8 uStack_2e0;
  QPDFObjectHandle local_2d8;
  QPDFObjectHandle local_2c8;
  int local_2b8;
  int local_2b4;
  int idx;
  int nitems;
  QPDFObjectHandle items;
  int nkids;
  undefined1 local_278 [8];
  QPDFObjectHandle kids;
  string local_260;
  QPDFObjGen local_23c;
  undefined1 local_231;
  undefined1 local_230 [8];
  QPDFObjectHandle node;
  set seen;
  QPDFObjectHandle local_1e8;
  byte local_1d1;
  QPDFObjectHandle local_1d0;
  byte local_1b9;
  QPDFObjectHandle local_1b8;
  byte local_1a1;
  QPDFObjectHandle local_1a0;
  byte local_189;
  QPDFObjectHandle local_188;
  byte local_171;
  QPDFObjectHandle local_170;
  int local_15c;
  iterator local_158;
  undefined1 local_e8 [8];
  iterator last_item;
  iterator first_item;
  bool return_prev_if_not_found_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  iterator *result;
  
  begin((iterator *)
        &last_item.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this);
  end((iterator *)local_e8,this);
  end(&local_158,this);
  bVar3 = NNTreeIterator::operator==
                    ((NNTreeIterator *)
                     &last_item.ivalue.second.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_158);
  NNTreeIterator::~NNTreeIterator(&local_158);
  if (bVar3) {
    end(__return_storage_ptr__,this);
    local_15c = 1;
  }
  else {
    bVar4 = NNTreeIterator::valid
                      ((NNTreeIterator *)
                       &last_item.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_171 = 0;
    local_189 = 0;
    local_1a1 = 0;
    bVar3 = false;
    if (bVar4) {
      pNVar1 = this->details;
      pTVar8 = NNTreeIterator::operator->
                         ((NNTreeIterator *)
                          &last_item.ivalue.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFObjectHandle(&local_170,&pTVar8->first);
      local_171 = 1;
      bVar6 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_170);
      bVar3 = false;
      if ((bVar6 & 1) != 0) {
        pNVar1 = this->details;
        QPDFObjectHandle::QPDFObjectHandle(&local_188,key);
        local_189 = 1;
        pTVar8 = NNTreeIterator::operator->
                           ((NNTreeIterator *)
                            &last_item.ivalue.second.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        QPDFObjectHandle::QPDFObjectHandle(&local_1a0,&pTVar8->first);
        local_1a1 = 1;
        iVar7 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_188,&local_1a0);
        bVar3 = iVar7 < 0;
      }
    }
    if ((local_1a1 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
    }
    if ((local_189 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_188);
    }
    if ((local_171 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_170);
    }
    if (bVar3) {
      end(__return_storage_ptr__,this);
      local_15c = 1;
    }
    else {
      bVar5 = NNTreeIterator::valid((NNTreeIterator *)local_e8);
      local_1b9 = 0;
      local_1d1 = 0;
      bVar4 = false;
      bVar3 = false;
      if (bVar5) {
        pNVar1 = this->details;
        pTVar8 = NNTreeIterator::operator->((NNTreeIterator *)local_e8);
        QPDFObjectHandle::QPDFObjectHandle(&local_1b8,&pTVar8->first);
        local_1b9 = 1;
        bVar6 = (**(code **)(*(long *)pNVar1 + 8))(pNVar1,&local_1b8);
        bVar3 = false;
        if ((bVar6 & 1) != 0) {
          pNVar1 = this->details;
          QPDFObjectHandle::QPDFObjectHandle(&local_1d0,key);
          local_1d1 = 1;
          pTVar8 = NNTreeIterator::operator->((NNTreeIterator *)local_e8);
          QPDFObjectHandle::QPDFObjectHandle(&local_1e8,&pTVar8->first);
          bVar4 = true;
          iVar7 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_1d0,&local_1e8);
          bVar3 = 0 < iVar7;
        }
      }
      if (bVar4) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_1e8);
      }
      if ((local_1d1 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
      }
      if ((local_1b9 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
      }
      if (bVar3) {
        if (return_prev_if_not_found) {
          NNTreeIterator::NNTreeIterator(__return_storage_ptr__,(NNTreeIterator *)local_e8);
          local_15c = 1;
        }
        else {
          end(__return_storage_ptr__,this);
          local_15c = 1;
        }
      }
      else {
        QPDFObjGen::set::set
                  ((set *)&node.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_230,&this->oh);
        local_231 = 0;
        NNTreeIterator::NNTreeIterator(__return_storage_ptr__,this);
        do {
          local_23c = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_230);
          bVar3 = QPDFObjGen::set::add
                            ((set *)&node.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,local_23c);
          if (!bVar3) {
            QTC::TC("qpdf","NNTree loop in find",0);
            pQVar2 = this->qpdf;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_260,"loop detected in find",
                       (allocator<char> *)
                       ((long)&kids.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            ::error(pQVar2,(QPDFObjectHandle *)local_230,&local_260);
            std::__cxx11::string::~string((string *)&local_260);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&kids.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&nkids,"/Kids",
                     (allocator<char> *)
                     ((long)&items.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_278,(string *)local_230);
          std::__cxx11::string::~string((string *)&nkids);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&items.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
          bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_278);
          if (bVar3) {
            local_46c = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_278);
          }
          else {
            local_46c = 0;
          }
          items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ = local_46c;
          (*(code *)**(undefined8 **)this->details)();
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&idx,(string *)local_230);
          bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&idx);
          if (bVar3) {
            local_484 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&idx);
          }
          else {
            local_484 = 0;
          }
          local_2b4 = local_484;
          if (local_484 < 1) {
            if ((int)items.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
                1) {
              QTC::TC("qpdf","NNTree bad node during find",0);
              pQVar2 = this->qpdf;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_378,"bad node during find",&local_379);
              ::error(pQVar2,(QPDFObjectHandle *)local_230,&local_378);
              std::__cxx11::string::~string((string *)&local_378);
              std::allocator<char>::~allocator(&local_379);
            }
            else {
              QPDFObjectHandle::QPDFObjectHandle(&local_300,key);
              QPDFObjectHandle::QPDFObjectHandle(&local_310,(QPDFObjectHandle *)local_278);
              local_320 = compareKeyKid;
              uStack_318 = 0;
              iVar7 = binarySearch(this,&local_300,&local_310,
                                   (int)items.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi,true,in_R9);
              QPDFObjectHandle::~QPDFObjectHandle(&local_310);
              QPDFObjectHandle::~QPDFObjectHandle(&local_300);
              local_2ec = iVar7;
              if (iVar7 == -1) {
                QTC::TC("qpdf","NNTree -1 in binary search",0);
                pQVar2 = this->qpdf;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_340,
                           "unexpected -1 from binary search of kids; limits may by wrong",
                           &local_341);
                ::error(pQVar2,(QPDFObjectHandle *)local_230,&local_340);
                std::__cxx11::string::~string((string *)&local_340);
                std::allocator<char>::~allocator(&local_341);
              }
              NNTreeIterator::addPathElement
                        (__return_storage_ptr__,(QPDFObjectHandle *)local_230,local_2ec);
              QPDFObjectHandle::getArrayItem(&local_358,(int)local_278);
              QPDFObjectHandle::operator=((QPDFObjectHandle *)local_230,&local_358);
              QPDFObjectHandle::~QPDFObjectHandle(&local_358);
            }
            local_15c = 0;
          }
          else {
            QPDFObjectHandle::QPDFObjectHandle(&local_2c8,key);
            QPDFObjectHandle::QPDFObjectHandle(&local_2d8,(QPDFObjectHandle *)&idx);
            pcStack_2e8 = compareKeyItem;
            uStack_2e0 = 0;
            iVar7 = binarySearch(this,&local_2c8,&local_2d8,local_2b4 / 2,return_prev_if_not_found,
                                 in_R9);
            QPDFObjectHandle::~QPDFObjectHandle(&local_2d8);
            QPDFObjectHandle::~QPDFObjectHandle(&local_2c8);
            local_2b8 = iVar7;
            if (-1 < iVar7) {
              NNTreeIterator::setItemNumber
                        (__return_storage_ptr__,(QPDFObjectHandle *)local_230,iVar7 * 2);
            }
            local_15c = 3;
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&idx);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_278);
        } while (local_15c == 0);
        local_15c = 1;
        local_231 = 1;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_230);
        QPDFObjGen::set::~set
                  ((set *)&node.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
  }
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_e8);
  NNTreeIterator::~NNTreeIterator
            ((NNTreeIterator *)
             &last_item.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::findInternal(QPDFObjectHandle key, bool return_prev_if_not_found)
{
    auto first_item = begin();
    auto last_item = end();
    if (first_item == end()) {
        // Empty
        return end();
    } else if (
        first_item.valid() && details.keyValid(first_item->first) &&
        details.compareKeys(key, first_item->first) < 0) {
        // Before the first key
        return end();
    } else if (
        last_item.valid() && details.keyValid(last_item->first) &&
        details.compareKeys(key, last_item->first) > 0) {
        // After the last key
        if (return_prev_if_not_found) {
            return last_item;
        } else {
            return end();
        }
    }

    QPDFObjGen::set seen;
    auto node = this->oh;
    iterator result(*this);

    while (true) {
        if (!seen.add(node)) {
            QTC::TC("qpdf", "NNTree loop in find");
            error(qpdf, node, "loop detected in find");
        }

        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;
        if (nitems > 0) {
            int idx = binarySearch(
                key, items, nitems / 2, return_prev_if_not_found, &NNTreeImpl::compareKeyItem);
            if (idx >= 0) {
                result.setItemNumber(node, 2 * idx);
            }
            break;
        } else if (nkids > 0) {
            int idx = binarySearch(key, kids, nkids, true, &NNTreeImpl::compareKeyKid);
            if (idx == -1) {
                QTC::TC("qpdf", "NNTree -1 in binary search");
                error(
                    qpdf,
                    node,
                    "unexpected -1 from binary search of kids;"
                    " limits may by wrong");
            }
            result.addPathElement(node, idx);
            node = kids.getArrayItem(idx);
        } else {
            QTC::TC("qpdf", "NNTree bad node during find");
            error(qpdf, node, "bad node during find");
        }
    }

    return result;
}